

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O0

Function * __thiscall
stackjit::ByteCodeParser::parseFunctionDefinition
          (Function *__return_storage_ptr__,ByteCodeParser *this,bool isExternal)

{
  bool bVar1;
  runtime_error *this_00;
  string local_110 [32];
  string local_f0 [32];
  undefined1 local_d0 [8];
  string returnType;
  int local_ac;
  undefined1 local_a8 [8];
  string parameter;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  undefined1 local_60 [40];
  string name;
  bool isExternal_local;
  ByteCodeParser *this_local;
  
  nextToken_abi_cxx11_((ByteCodeParser *)(local_60 + 0x20));
  nextToken_abi_cxx11_((ByteCodeParser *)local_60);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"(");
  std::__cxx11::string::~string((string *)local_60);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Expected \'(\' after function name.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
  do {
    nextToken_abi_cxx11_((ByteCodeParser *)local_a8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,")");
    if (bVar1) {
      local_ac = 3;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88,(value_type *)local_a8);
      local_ac = 0;
    }
    std::__cxx11::string::~string((string *)local_a8);
  } while (local_ac == 0);
  nextToken_abi_cxx11_((ByteCodeParser *)local_d0);
  std::__cxx11::string::string(local_f0,(string *)(local_60 + 0x20));
  std::__cxx11::string::string(local_110,(string *)local_d0);
  Loader::Function::Function
            (__return_storage_ptr__,(string *)local_f0,(string *)local_110,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88,isExternal);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Loader::Function ByteCodeParser::parseFunctionDefinition(bool isExternal) {
		auto name = nextToken();

		if (nextToken() != "(") {
			throw std::runtime_error("Expected '(' after function name.");
		}

		std::vector<std::string> parameters;
		while (true) {
			auto parameter = nextToken();
			if (parameter == ")") {
				break;
			}

			parameters.push_back(parameter);
		}

		auto returnType = nextToken();
		return Loader::Function(name, returnType, parameters, isExternal);
	}